

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.h
# Opt level: O2

void __thiscall
mocker::nasm::Module::emplaceDirective<mocker::nasm::Global,char_const(&)[5]>
          (Module *this,char (*args) [5])

{
  shared_ptr<mocker::nasm::Global> local_20;
  
  std::make_shared<mocker::nasm::Global,char_const(&)[5]>((char (*) [5])&local_20);
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,std::allocator<std::shared_ptr<mocker::nasm::Directive>>>
  ::emplace_back<std::shared_ptr<mocker::nasm::Global>>
            ((vector<std::shared_ptr<mocker::nasm::Directive>,std::allocator<std::shared_ptr<mocker::nasm::Directive>>>
              *)this,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<mocker::nasm::Global,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void emplaceDirective(Args &&... args) {
    directives.emplace_back(
        std::make_shared<Type>(std::forward<Args>(args)...));
  }